

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O0

bool FOOLElimination::needsElimination(FormulaUnit *unit)

{
  bool bVar1;
  Connective CVar2;
  FormulaUnit *in_RDI;
  Formula *formula;
  SubformulaIterator sfi;
  SubformulaIterator *in_stack_000000b8;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  SubformulaIterator *in_stack_ffffffffffffff90;
  SubformulaIterator *in_stack_ffffffffffffffa0;
  bool local_1;
  
  Kernel::FormulaUnit::formula(in_RDI);
  Kernel::SubformulaIterator::SubformulaIterator
            (in_stack_ffffffffffffff90,
             (Formula *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  do {
    while( true ) {
      bVar1 = Kernel::SubformulaIterator::hasNext(in_stack_000000b8);
      if (!bVar1) {
        local_1 = false;
        goto LAB_00b928d6;
      }
      in_stack_ffffffffffffffa0 =
           (SubformulaIterator *)Kernel::SubformulaIterator::next(in_stack_ffffffffffffff90);
      CVar2 = Kernel::Formula::connective((Formula *)in_stack_ffffffffffffffa0);
      if (CVar2 != LITERAL) break;
      in_stack_ffffffffffffff90 =
           (SubformulaIterator *)Kernel::Formula::literal((Formula *)0xb92881);
      bVar1 = Kernel::Term::shared((Term *)0xb92892);
      if (!bVar1) {
        local_1 = true;
LAB_00b928d6:
        Kernel::SubformulaIterator::~SubformulaIterator(in_stack_ffffffffffffffa0);
        return local_1;
      }
    }
  } while (CVar2 != BOOL_TERM);
  local_1 = true;
  goto LAB_00b928d6;
}

Assistant:

bool FOOLElimination::needsElimination(FormulaUnit* unit) {
  /**
   * Be careful with the difference between FOOLElimination::needsElimination
   * and Property::_hasFOOL!
   *
   * The former checks that the formula has subterms that are not syntactically
   * first-order. That only includes boolean variables, used as formulas,
   * formulas, used as terms, $let and $ite. This check is needed to decide
   * whether any of the transformations from FOOLElimination are yet to be
   * applied.
   *
   * The latter checks if there is an occurrence of any boolean term. This is
   * needed to identify if boolean theory axioms must be added to the search
   * space.
   *
   * For an example, consider the following falsum:
   * tff(1, conjecture, ![X : $o, Y : $o]: (X = Y)).
   *
   * $o will be parsed as $bool, and the equality will be parsed simply as
   * equality between $bool. No transformations from FOOLElimination are needed
   * to be applied here, however, theory axioms are needed to be added. Thus,
   * FOOLElimination::needsElimination should return false for this input,
   * whereas Property::_hasFOOL must be set to true.
   */

  SubformulaIterator sfi(unit->formula());
  while(sfi.hasNext()) {
    Formula* formula = sfi.next();
    switch (formula->connective()) {
      case LITERAL:
        if (!formula->literal()->shared()) {
          return true;
        }
        break;
      case BOOL_TERM:
        return true;
      default:
        break;
    }
  }
  return false;
}